

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

void EvaluateNode(size_t block_start,size_t pos,size_t max_backward_limit,size_t gap,
                 int *starting_dist_cache,ZopfliCostModel *model,StartPosQueue *queue,
                 ZopfliNode *nodes)

{
  size_t *psVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  uint uVar20;
  size_t sStack_50;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  
  fStack_3c = nodes[pos].u.cost;
  if (pos == 0) {
    uVar15 = 0;
  }
  else {
    uVar12 = nodes[pos].distance;
    uVar20 = nodes[pos].length & 0x1ffffff;
    uVar4 = nodes[pos].dcode_insert_length;
    if (((ulong)uVar12 <= max_backward_limit + gap) &&
       ((ulong)uVar12 + (ulong)uVar20 <= block_start + pos + gap)) {
      iVar13 = (uVar4 >> 0x1b) - 1;
      if (uVar4 < 0x8000000) {
        iVar13 = uVar12 + 0xf;
      }
      if (iVar13 != 0) {
        uVar15 = pos & 0xffffffff;
        goto LAB_01c130ed;
      }
    }
    uVar15 = (ulong)nodes[pos - ((uVar4 & 0x7ffffff) + uVar20)].u.next;
  }
LAB_01c130ed:
  nodes[pos].u.next = (uint32_t)uVar15;
  fStack_40 = model->literal_costs_[pos] - *model->literal_costs_;
  if (fStack_40 < fStack_3c) {
    return;
  }
  fStack_40 = fStack_3c - fStack_40;
  uVar17 = 0;
  if ((uint32_t)uVar15 != 0) {
    do {
      uVar14 = uVar17;
      uVar12 = nodes[uVar15].dcode_insert_length;
      uVar4 = nodes[uVar15].length;
      uVar17 = uVar14 + 1;
      *(uint32_t *)((long)&sStack_50 + uVar14 * 4) = nodes[uVar15].distance;
      if (2 < uVar14) break;
      lVar16 = uVar15 - ((uVar4 & 0x1ffffff) + (uVar12 & 0x7ffffff));
      uVar15 = (ulong)nodes[lVar16].u.next;
    } while (nodes[lVar16].u.next != 0);
    if (2 < uVar14) goto LAB_01c13194;
  }
  switchD_015de399::default
            ((void *)((long)&sStack_50 + uVar17 * 4),starting_dist_cache,uVar17 * -4 + 0x10);
LAB_01c13194:
  uVar17 = queue->idx_ + 1;
  uVar12 = ~(uint)queue->idx_ & 7;
  uVar15 = 8;
  if (uVar17 < 8) {
    uVar15 = uVar17;
  }
  queue->idx_ = uVar17;
  puVar18 = (undefined8 *)((long)queue->q_[0].distance_cache + (ulong)(uVar12 << 5) + 8);
  *puVar18 = local_48;
  puVar18[1] = CONCAT44(fStack_3c,fStack_40);
  psVar1 = (size_t *)((long)queue->q_[0].distance_cache + ((ulong)(uVar12 << 5) - 8));
  *psVar1 = pos;
  psVar1[1] = sStack_50;
  if (1 < uVar17) {
    lVar16 = uVar15 - 1;
    do {
      uVar15 = (ulong)((uVar12 & 7) << 5);
      fVar3 = *(float *)((long)queue->q_[0].distance_cache + uVar15 + 0x10);
      uVar17 = (ulong)((uVar12 + 1 & 7) << 5);
      pfVar2 = (float *)((long)queue->q_[0].distance_cache + uVar17 + 0x10);
      if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
        puVar18 = (undefined8 *)((long)queue->q_[0].distance_cache + (uVar15 - 8));
        puVar19 = (undefined8 *)((long)queue->q_[0].distance_cache + (uVar17 - 8));
        uVar5 = *puVar18;
        uVar6 = puVar18[1];
        uVar7 = puVar18[2];
        uVar8 = puVar18[3];
        uVar9 = *puVar19;
        uVar10 = puVar19[1];
        uVar11 = puVar19[3];
        puVar18[2] = puVar19[2];
        puVar18[3] = uVar11;
        *puVar18 = uVar9;
        puVar18[1] = uVar10;
        puVar19[2] = uVar7;
        puVar19[3] = uVar8;
        *puVar19 = uVar5;
        puVar19[1] = uVar6;
      }
      uVar12 = uVar12 + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  return;
}

Assistant:

static void EvaluateNode(
    const size_t block_start, const size_t pos, const size_t max_backward_limit,
    const size_t gap, const int* starting_dist_cache,
    const ZopfliCostModel* model, StartPosQueue* queue, ZopfliNode* nodes) {
  /* Save cost, because ComputeDistanceCache invalidates it. */
  float node_cost = nodes[pos].u.cost;
  nodes[pos].u.shortcut = ComputeDistanceShortcut(
      block_start, pos, max_backward_limit, gap, nodes);
  if (node_cost <= ZopfliCostModelGetLiteralCosts(model, 0, pos)) {
    PosData posdata;
    posdata.pos = pos;
    posdata.cost = node_cost;
    posdata.costdiff = node_cost -
        ZopfliCostModelGetLiteralCosts(model, 0, pos);
    ComputeDistanceCache(
        pos, starting_dist_cache, nodes, posdata.distance_cache);
    StartPosQueuePush(queue, &posdata);
  }
}